

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_registry.hpp
# Opt level: O0

service * boost::asio::detail::service_registry::
          create<boost::asio::detail::reactive_descriptor_service,boost::asio::io_context>
                    (void *owner)

{
  service *psVar1;
  io_context *in_RDI;
  reactive_descriptor_service *unaff_retaddr;
  
  psVar1 = (service *)operator_new(0x30);
  reactive_descriptor_service::reactive_descriptor_service(unaff_retaddr,in_RDI);
  return psVar1;
}

Assistant:

execution_context::service* service_registry::create(void* owner)
{
  return new Service(*static_cast<Owner*>(owner));
}